

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_DRAIN_STAT(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t flag;
  wchar_t stat;
  uint32_t uVar4;
  wchar_t wVar5;
  obj_property *poVar6;
  char dam_text [32];
  char local_58 [40];
  
  stat = context->subtype;
  flag = sustain_flag(stat);
  _Var1 = player_of_has(player,flag);
  _Var2 = flag_has_dbg((player->state).pflags,10,0x49,"player->state.pflags","(PF_CLARITY)");
  _Var3 = flag_has_dbg((player->state).pflags,10,0x48,"player->state.pflags","(PF_ATHLETICS)");
  if (flag < L'\0') goto LAB_0013dc01;
  context->ident = true;
  if (stat < L'\0') {
    stat = Rand_div(5);
  }
  if (_Var2) {
    uVar4 = Rand_div(2);
    _Var1 = _Var1 || (uint)(stat + L'\xffffffff') < 2 && uVar4 == 0;
  }
  if (_Var3) {
    uVar4 = Rand_div(2);
    if ((uint)(stat + L'\xfffffffd') < 2 && uVar4 == 0 || _Var1 != false) {
LAB_0013dbd5:
      equip_learn_flag(player,flag);
      poVar6 = lookup_obj_property(L'\x01',stat);
      msg("You feel very %s for a moment, but the feeling passes.",poVar6->neg_adj);
      goto LAB_0013dc01;
    }
  }
  else if (_Var1 != false) goto LAB_0013dbd5;
  _Var1 = player_stat_dec(player,stat,false);
  if (_Var1) {
    wVar5 = effect_calculate_value(context,false);
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0x18] = '\0';
    local_58[0x19] = '\0';
    local_58[0x1a] = '\0';
    local_58[0x1b] = '\0';
    local_58[0x1c] = '\0';
    local_58[0x1d] = '\0';
    local_58[0x1e] = '\0';
    local_58[0x1f] = '\0';
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    wVar5 = player_apply_damage_reduction(player,wVar5);
    equip_learn_flag(player,flag);
    if ((L'\0' < wVar5) && ((player->opts).opt[3] == true)) {
      strnfmt(local_58,0x20," (%d)",(ulong)(uint)wVar5);
    }
    poVar6 = lookup_obj_property(L'\x01',stat);
    msgt(0x99,"You feel very %s.%s",poVar6->neg_adj,local_58);
    take_hit(player,wVar5,"stat drain");
  }
LAB_0013dc01:
  return L'\xffffffff' < flag;
}

Assistant:

bool effect_handler_DRAIN_STAT(effect_handler_context_t *context)
{
	int stat = context->subtype;
	int flag = sustain_flag(stat);
	bool sust = player_of_has(player, flag);
	bool clarity = player_has(player, PF_CLARITY);
	bool athletics = player_has(player, PF_ATHLETICS);

	/* Bounds check */
	if (flag < 0) return false;

	/* ID */
	context->ident = true;

	/* Pick a random stat if needed */
	if (stat < 0) {
		stat = randint0(STAT_MAX);
	}

	/* Check for specialty ability partial sustains */
	if (clarity && one_in_(2) && ((stat == STAT_INT) || (stat == STAT_WIS))) {
		sust = true;
	}
	if (athletics && one_in_(2) && ((stat == STAT_DEX) || (stat == STAT_CON))) {
		sust = true;
	}

	/* Sustain */
	if (sust) {
		/* Notice effect */
		equip_learn_flag(player, flag);

		/* Message */
		msg("You feel very %s for a moment, but the feeling passes.",
				   desc_stat(stat, false));

		return (true);
	}

	/* Attempt to reduce the stat */
	if (player_stat_dec(player, stat, false)) {
		int dam = effect_calculate_value(context, false);
		char dam_text[32] = "";

		dam = player_apply_damage_reduction(player, dam);

		/* Notice effect */
		equip_learn_flag(player, flag);

		/* Message */
		if (dam > 0 && OPT(player, show_damage)) {
			strnfmt(dam_text, sizeof(dam_text), " (%d)", dam);
		}
		msgt(MSG_DRAIN_STAT, "You feel very %s.%s",
			desc_stat(stat, false), dam_text);
		take_hit(player, dam, "stat drain");
	}

	return (true);
}